

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O3

uint32_t * unpack9_16(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint32_t uVar2;
  
  *out = (*in & 0x1ff) + base;
  out[1] = (*in >> 9 & 0x1ff) + base;
  out[2] = (*in >> 0x12 & 0x1ff) + base;
  uVar1 = *in;
  out[3] = uVar1 >> 0x1b;
  out[3] = (uVar1 >> 0x1b) + base + (in[1] & 0xf) * 0x20;
  out[4] = (in[1] >> 4 & 0x1ff) + base;
  out[5] = (in[1] >> 0xd & 0x1ff) + base;
  out[6] = (in[1] >> 0x16 & 0x1ff) + base;
  uVar2 = in[1];
  out[7] = -((int)uVar2 >> 0x1f);
  out[7] = -((int)uVar2 >> 0x1f) + base + (in[2] & 0xff) * 2;
  out[8] = (in[2] >> 8 & 0x1ff) + base;
  out[9] = (in[2] >> 0x11 & 0x1ff) + base;
  uVar1 = in[2];
  out[10] = uVar1 >> 0x1a;
  out[10] = (uVar1 >> 0x1a) + base + (in[3] & 7) * 0x40;
  out[0xb] = (in[3] >> 3 & 0x1ff) + base;
  out[0xc] = (in[3] >> 0xc & 0x1ff) + base;
  out[0xd] = (in[3] >> 0x15 & 0x1ff) + base;
  uVar1 = in[3];
  out[0xe] = uVar1 >> 0x1e;
  out[0xe] = (uVar1 >> 0x1e) + base + (in[4] & 0x7f) * 4;
  out[0xf] = (in[4] >> 7 & 0x1ff) + base;
  return in + 5;
}

Assistant:

uint32_t * unpack9_16( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   % (1U << 9 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  9  )   % (1U << 9 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  18  )   % (1U << 9 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  27  ) ;
    ++in;
    *out |= ((*in) % (1U<< 4 ))<<( 9 - 4 );
    *out += base;
    out++;
    *out = ( (*in) >>  4  )   % (1U << 9 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  13  )   % (1U << 9 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  22  )   % (1U << 9 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  31  ) ;
    ++in;
    *out |= ((*in) % (1U<< 8 ))<<( 9 - 8 );
    *out += base;
    out++;
    *out = ( (*in) >>  8  )   % (1U << 9 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  17  )   % (1U << 9 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  26  ) ;
    ++in;
    *out |= ((*in) % (1U<< 3 ))<<( 9 - 3 );
    *out += base;
    out++;
    *out = ( (*in) >>  3  )   % (1U << 9 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  12  )   % (1U << 9 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  21  )   % (1U << 9 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  30  ) ;
    ++in;
    *out |= ((*in) % (1U<< 7 ))<<( 9 - 7 );
    *out += base;
    out++;
    *out = ( (*in) >>  7  )   % (1U << 9 )  ;
    *out += base;
    out++;

    return in + 1;
}